

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NurbsSurfaceGeometry.h
# Opt level: O0

int __thiscall
anurbs::NurbsSurfaceGeometry<3L>::clone
          (NurbsSurfaceGeometry<3L> *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...
          )

{
  double dVar1;
  long lVar2;
  bool bVar3;
  Index IVar4;
  double *pdVar5;
  element_type *peVar6;
  Index IVar7;
  Index local_a0;
  Index i_3;
  Ref<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_0,_Eigen::InnerStride<1>_> local_88;
  long local_78;
  Index i_2;
  Index i_1;
  Index i;
  bool local_49;
  Index local_48;
  Index local_40;
  long local_38;
  long local_30;
  unique_ptr<anurbs::NurbsSurfaceGeometry<3L>,_std::default_delete<anurbs::NurbsSurfaceGeometry<3L>_>_>
  local_28;
  undefined1 local_19;
  __fn *local_18;
  NurbsSurfaceGeometry<3L> *this_local;
  Pointer<Type> *clone;
  
  local_19 = 0;
  local_18 = __fn;
  this_local = this;
  local_30 = (**(code **)(*(long *)__fn + 0x10))();
  local_38 = (**(code **)(*(long *)__fn + 0x18))();
  local_40 = nb_poles_u((NurbsSurfaceGeometry<3L> *)__fn);
  local_48 = nb_poles_v((NurbsSurfaceGeometry<3L> *)__fn);
  local_49 = is_rational((NurbsSurfaceGeometry<3L> *)__fn);
  new_<anurbs::NurbsSurfaceGeometry<3l>,long,long,long,long,bool>
            ((anurbs *)&local_28,&local_30,&local_38,&local_40,&local_48,&local_49);
  std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>::
  shared_ptr<anurbs::NurbsSurfaceGeometry<3l>,std::default_delete<anurbs::NurbsSurfaceGeometry<3l>>,void>
            ((shared_ptr<anurbs::NurbsSurfaceGeometry<3l>> *)this,&local_28);
  std::
  unique_ptr<anurbs::NurbsSurfaceGeometry<3L>,_std::default_delete<anurbs::NurbsSurfaceGeometry<3L>_>_>
  ::~unique_ptr(&local_28);
  for (i_1 = 0; IVar7 = i_1, IVar4 = nb_knots_u((NurbsSurfaceGeometry<3L> *)__fn), IVar7 < IVar4;
      i_1 = i_1 + 1) {
    pdVar5 = knot_u((NurbsSurfaceGeometry<3L> *)__fn,i_1);
    dVar1 = *pdVar5;
    peVar6 = std::
             __shared_ptr_access<anurbs::NurbsSurfaceGeometry<3L>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<anurbs::NurbsSurfaceGeometry<3L>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    pdVar5 = knot_u(peVar6,i_1);
    *pdVar5 = dVar1;
  }
  for (i_2 = 0; IVar7 = i_2, IVar4 = nb_knots_v((NurbsSurfaceGeometry<3L> *)__fn), IVar7 < IVar4;
      i_2 = i_2 + 1) {
    pdVar5 = knot_v((NurbsSurfaceGeometry<3L> *)__fn,i_2);
    dVar1 = *pdVar5;
    peVar6 = std::
             __shared_ptr_access<anurbs::NurbsSurfaceGeometry<3L>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<anurbs::NurbsSurfaceGeometry<3L>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    pdVar5 = knot_v(peVar6,i_2);
    *pdVar5 = dVar1;
  }
  for (local_78 = 0; lVar2 = local_78, IVar7 = nb_poles((NurbsSurfaceGeometry<3L> *)__fn),
      lVar2 < IVar7; local_78 = local_78 + 1) {
    pole(&local_88,(NurbsSurfaceGeometry<3L> *)__fn,local_78);
    peVar6 = std::
             __shared_ptr_access<anurbs::NurbsSurfaceGeometry<3L>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<anurbs::NurbsSurfaceGeometry<3L>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    pole((Ref<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_0,_Eigen::InnerStride<1>_> *)&i_3,peVar6,
         local_78);
    Eigen::Ref<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_0,_Eigen::InnerStride<1>_>::operator=
              ((Ref<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_0,_Eigen::InnerStride<1>_> *)&i_3,
               &local_88);
  }
  bVar3 = is_rational((NurbsSurfaceGeometry<3L> *)__fn);
  if (bVar3) {
    for (local_a0 = 0; IVar7 = nb_poles((NurbsSurfaceGeometry<3L> *)__fn), local_a0 < IVar7;
        local_a0 = local_a0 + 1) {
      pdVar5 = weight((NurbsSurfaceGeometry<3L> *)__fn,local_a0);
      dVar1 = *pdVar5;
      peVar6 = std::
               __shared_ptr_access<anurbs::NurbsSurfaceGeometry<3L>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<anurbs::NurbsSurfaceGeometry<3L>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      pdVar5 = weight(peVar6,local_a0);
      *pdVar5 = dVar1;
    }
  }
  return (int)this;
}

Assistant:

Pointer<Type> clone()
    {
        Pointer<Type> clone = new_<Type>(
            this->degree_u(), this->degree_v(), this->nb_poles_u(),
            this->nb_poles_v(), this->is_rational());

        for (Index i = 0; i < this->nb_knots_u(); i++) {
            clone->knot_u(i) = this->knot_u(i);
        }

        for (Index i = 0; i < this->nb_knots_v(); i++) {
            clone->knot_v(i) = this->knot_v(i);
        }

        for (Index i = 0; i < this->nb_poles(); i++) {
            clone->pole(i) = this->pole(i);
        }

        if (this->is_rational()) {
            for (Index i = 0; i < this->nb_poles(); i++) {
                clone->weight(i) = this->weight(i);
            }
        }

        return clone;
    }